

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationAngle.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationAngle::ArchiveIN(ChLinkMotorRotationAngle *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMotorRotationAngle>(marchive);
  ChLinkMotorRotation::ArchiveIN(&this->super_ChLinkMotorRotation,marchive);
  local_28._value = (double *)&(this->super_ChLinkMotorRotation).field_0x278;
  local_28._name = "rot_offset";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChLinkMotorRotationAngle::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotorRotationAngle>();

    // deserialize parent class
    ChLinkMotorRotation::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(rot_offset);
}